

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::CPPextension(TPpContext *this,TPpToken *ppToken)

{
  uint uVar1;
  int iVar2;
  char local_438 [8];
  char extensionName [1025];
  int token;
  int line;
  TPpToken *ppToken_local;
  TPpContext *this_local;
  
  uVar1 = (ppToken->loc).line;
  iVar2 = scanToken(this,ppToken);
  if (iVar2 == 10) {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"extension name not specified","#extension","");
    this_local._4_4_ = 10;
  }
  else {
    if (iVar2 != 0xa2) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"extension name expected","#extension","");
    }
    snprintf(local_438,0x401,"%s",ppToken->name);
    this_local._4_4_ = scanToken(this,ppToken);
    if (this_local._4_4_ == 0x3a) {
      this_local._4_4_ = scanToken(this,ppToken);
      if (this_local._4_4_ == 0xa2) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[10])
                  (this->parseContext,(ulong)uVar1,local_438,ppToken->name);
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x3f])
                  (this->parseContext,(ulong)uVar1,local_438,ppToken->name);
        this_local._4_4_ = scanToken(this,ppToken);
        if (this_local._4_4_ != 10) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,ppToken,"extra tokens -- expected newline","#extension","");
        }
      }
      else {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,"behavior for extension not specified","#extension",""
                  );
      }
    }
    else {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"\':\' missing after extension name","#extension","");
    }
  }
  return this_local._4_4_;
}

Assistant:

int TPpContext::CPPextension(TPpToken* ppToken)
{
    int line = ppToken->loc.line;
    int token = scanToken(ppToken);
    char extensionName[MaxTokenLength + 1];

    if (token=='\n') {
        parseContext.ppError(ppToken->loc, "extension name not specified", "#extension", "");
        return token;
    }

    if (token != PpAtomIdentifier)
        parseContext.ppError(ppToken->loc, "extension name expected", "#extension", "");

    snprintf(extensionName, sizeof(extensionName), "%s", ppToken->name);

    token = scanToken(ppToken);
    if (token != ':') {
        parseContext.ppError(ppToken->loc, "':' missing after extension name", "#extension", "");
        return token;
    }

    token = scanToken(ppToken);
    if (token != PpAtomIdentifier) {
        parseContext.ppError(ppToken->loc, "behavior for extension not specified", "#extension", "");
        return token;
    }

    parseContext.updateExtensionBehavior(line, extensionName, ppToken->name);
    parseContext.notifyExtensionDirective(line, extensionName, ppToken->name);

    token = scanToken(ppToken);
    if (token == '\n')
        return token;
    else
        parseContext.ppError(ppToken->loc,  "extra tokens -- expected newline", "#extension","");

    return token;
}